

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

bool __thiscall ON_NurbsCage::Write(ON_NurbsCage *this,ON_BinaryArchive *archive)

{
  long lVar1;
  undefined1 auVar2 [16];
  ON_BinaryArchive *pOVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  double *p;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double adStack_60 [2];
  ulong local_50;
  int local_44;
  double *local_40;
  ON_BinaryArchive *local_38;
  
  adStack_60[0] = 2.74529058308626e-317;
  bVar4 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (!bVar4) {
    return false;
  }
  adStack_60[0] = 2.74530046439918e-317;
  bVar4 = ON_BinaryArchive::WriteInt(archive,this->m_dim);
  local_38 = archive;
  if (bVar4) {
    adStack_60[0] = 2.74531281604032e-317;
    bVar4 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_is_rat);
    if (bVar4) {
      adStack_60[0] = 2.74532269735324e-317;
      bVar4 = ON_BinaryArchive::WriteInt(archive,this->m_order[0]);
      if (bVar4) {
        adStack_60[0] = 2.74533257866616e-317;
        bVar4 = ON_BinaryArchive::WriteInt(archive,this->m_order[1]);
        if (bVar4) {
          adStack_60[0] = 2.74534245997907e-317;
          bVar4 = ON_BinaryArchive::WriteInt(archive,this->m_order[2]);
          if (bVar4) {
            adStack_60[0] = 2.74535234129199e-317;
            bVar4 = ON_BinaryArchive::WriteInt(archive,this->m_cv_count[0]);
            if (bVar4) {
              adStack_60[0] = 2.74536222260491e-317;
              bVar4 = ON_BinaryArchive::WriteInt(archive,this->m_cv_count[1]);
              if (bVar4) {
                adStack_60[0] = 2.74537012765524e-317;
                bVar4 = ON_BinaryArchive::WriteInt(archive,this->m_cv_count[2]);
                if (bVar4) {
                  adStack_60[0] = 2.74537852677122e-317;
                  iVar6 = ON_KnotCount(this->m_order[0],this->m_cv_count[0]);
                  adStack_60[0] = 2.74538593775591e-317;
                  bVar4 = ON_BinaryArchive::WriteDouble(archive,(long)iVar6,this->m_knot[0]);
                  if (bVar4) {
                    adStack_60[0] = 2.74539433687189e-317;
                    iVar6 = ON_KnotCount(this->m_order[1],this->m_cv_count[1]);
                    adStack_60[0] = 2.74540174785658e-317;
                    bVar4 = ON_BinaryArchive::WriteDouble(archive,(long)iVar6,this->m_knot[1]);
                    if (bVar4) {
                      adStack_60[0] = 2.74541014697256e-317;
                      iVar6 = ON_KnotCount(this->m_order[2],this->m_cv_count[2]);
                      adStack_60[0] = 2.74541755795724e-317;
                      bVar4 = ON_BinaryArchive::WriteDouble(archive,(long)iVar6,this->m_knot[2]);
                      goto LAB_0054ca3b;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar4 = false;
LAB_0054ca3b:
  auVar2 = _DAT_0069b120;
  local_50 = (long)this->m_dim + (ulong)this->m_is_rat;
  lVar1 = -(local_50 * 8 + 0xf & 0xfffffffffffffff0);
  local_40 = (double *)((long)adStack_60 + lVar1 + 8);
  if (0 < (int)local_50) {
    lVar7 = (local_50 & 0xffffffff) - 1;
    auVar13._8_4_ = (int)lVar7;
    auVar13._0_8_ = lVar7;
    auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar13 = auVar13 ^ _DAT_0069b120;
    auVar14 = _DAT_0069b170;
    do {
      auVar15 = auVar14 ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        local_40[uVar8] = -1.23432101234321e+308;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        *(undefined8 *)((long)&local_50 + uVar8 * 8 + lVar1) = 0xffe5f8bd9e331dd2;
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar7 + 2;
    } while (((int)local_50 + 1U & 0xfffffffe) != uVar8);
  }
  iVar6 = this->m_cv_count[0];
  if ((0 < iVar6) && (bVar4 != false)) {
    iVar11 = this->m_cv_count[1];
    dVar10 = 0.0;
    do {
      if ((0 < iVar11) && (bVar4 != false)) {
        iVar6 = this->m_cv_count[2];
        iVar12 = 0;
        adStack_60[1] = dVar10;
        do {
          if ((0 < iVar6) && (bVar4 != false)) {
            iVar11 = 1;
            local_44 = iVar12;
            do {
              pOVar3 = local_38;
              uVar8 = local_50;
              if (this->m_cv == (double *)0x0) {
                p = (double *)0x0;
              }
              else {
                p = this->m_cv +
                    (long)this->m_cv_stride[0] * (long)SUB84(dVar10,0) +
                    (long)this->m_cv_stride[1] * (long)iVar12 +
                    (long)(iVar11 + -1) * (long)this->m_cv_stride[2];
              }
              if (p == (double *)0x0) {
                p = local_40;
              }
              *(undefined8 *)((long)adStack_60 + lVar1) = 0x54cbaa;
              bVar4 = ON_BinaryArchive::WriteDouble(pOVar3,uVar8,p);
              iVar6 = this->m_cv_count[2];
            } while ((iVar11 < iVar6) && (iVar11 = iVar11 + 1, bVar4));
            iVar11 = this->m_cv_count[1];
            iVar12 = local_44;
          }
          iVar12 = iVar12 + 1;
        } while ((iVar12 < iVar11) && (bVar4 != false));
        iVar6 = this->m_cv_count[0];
        dVar10 = adStack_60[1];
      }
      uVar9 = SUB84(dVar10,0) + 1;
      dVar10 = (double)(ulong)uVar9;
    } while (((int)uVar9 < iVar6) && (bVar4 != false));
  }
  pOVar3 = local_38;
  *(undefined8 *)((long)adStack_60 + lVar1) = 0x54cbf4;
  bVar5 = ON_BinaryArchive::EndWrite3dmChunk(pOVar3);
  return (bool)(bVar5 & bVar4);
}

Assistant:

bool ON_NurbsCage::Write(ON_BinaryArchive& archive) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);

  if (rc)
  {
    rc = archive.WriteInt(m_dim);
    if(rc)
      rc = archive.WriteInt(m_is_rat);

    if (rc)
      rc = archive.WriteInt(m_order[0]);
    if (rc)
      rc = archive.WriteInt(m_order[1]);
    if (rc)
      rc = archive.WriteInt(m_order[2]);

    if (rc)
      rc = archive.WriteInt(m_cv_count[0]);
    if (rc)
      rc = archive.WriteInt(m_cv_count[1]);
    if (rc)
      rc = archive.WriteInt(m_cv_count[2]);

    if (rc)
      rc = archive.WriteDouble(KnotCount(0),m_knot[0]);
    if (rc)
      rc = archive.WriteDouble(KnotCount(1),m_knot[1]);
    if (rc)
      rc = archive.WriteDouble(KnotCount(2),m_knot[2]);

    int i,j,k;
    const int cv_dim = m_is_rat?(m_dim+1):m_dim;
    double* bogus_cv = (double*)alloca(cv_dim*sizeof(*bogus_cv));
    for ( i = 0; i < cv_dim; i++ )
      bogus_cv[i] = ON_UNSET_VALUE;
    for(i = 0; i < m_cv_count[0] && rc; i++)
    {
      for(j = 0; j < m_cv_count[1] && rc; j++)
      {
        for ( k = 0; k < m_cv_count[2] && rc; k++)
        {
          const double* cv = CV(i,j,k);
          if ( !cv )
            cv = bogus_cv;
          rc = archive.WriteDouble(cv_dim,cv);
        }
      }
    }

    if ( !archive.EndWrite3dmChunk() )
    {
      rc = false;
    }
  }

  return rc;
}